

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O3

string * __thiscall
phosg::join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,phosg *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  undefined8 *puVar3;
  long lVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = *(undefined8 **)(this + 0x10);
  puVar1 = *(undefined8 **)(this + 0x30);
  if (puVar3 != puVar1) {
    puVar2 = *(undefined8 **)(this + 0x20);
    lVar4 = *(long *)(this + 0x28);
    do {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,(char *)*puVar3,puVar3[1]);
      puVar3 = puVar3 + 4;
      if (puVar3 == puVar2) {
        puVar3 = *(undefined8 **)(lVar4 + 8);
        lVar4 = lVar4 + 8;
        puVar2 = puVar3 + 0x40;
      }
    } while (puVar3 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const ItemContainerT& items) {
  std::string ret;
  for (const auto& item : items) {
    ret += item;
  }
  return ret;
}